

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O2

int nn_sock_rm_ep(nn_sock *self,int eid)

{
  nn_list *self_00;
  nn_list_item *item;
  nn_list_item *pnVar1;
  nn_list_item **ppnVar2;
  int iVar3;
  
  nn_ctx_enter(&self->ctx);
  self_00 = &self->eps;
  item = nn_list_begin(self_00);
  iVar3 = -0x16;
  do {
    pnVar1 = nn_list_end(self_00);
    if (item == pnVar1) {
LAB_001481c7:
      nn_ctx_leave(&self->ctx);
      return iVar3;
    }
    ppnVar2 = &item[-8].prev;
    if (item == (nn_list_item *)0x0) {
      ppnVar2 = (nn_list_item **)0x0;
    }
    if (*(int *)((long)ppnVar2 + 0x74) == eid) {
      nn_list_erase(self_00,item);
      pnVar1 = nn_list_end(&self->sdeps);
      nn_list_insert(&self->sdeps,item,pnVar1);
      nn_ep_stop((nn_ep *)&item[-8].prev);
      iVar3 = 0;
      goto LAB_001481c7;
    }
    item = nn_list_next(self_00,item);
  } while( true );
}

Assistant:

int nn_sock_rm_ep (struct nn_sock *self, int eid)
{
    struct nn_list_item *it;
    struct nn_ep *ep;

    nn_ctx_enter (&self->ctx);

    /*  Find the specified enpoint. */
    ep = NULL;
    for (it = nn_list_begin (&self->eps);
          it != nn_list_end (&self->eps);
          it = nn_list_next (&self->eps, it)) {
        ep = nn_cont (it, struct nn_ep, item);
        if (ep->eid == eid)
            break;
        ep = NULL;
    }

    /*  The endpoint doesn't exist. */
    if (!ep) {
        nn_ctx_leave (&self->ctx);
        return -EINVAL;
    }

    /*  Move the endpoint from the list of active endpoints to the list
        of shutting down endpoints. */
    nn_list_erase (&self->eps, &ep->item);
    nn_list_insert (&self->sdeps, &ep->item, nn_list_end (&self->sdeps));

    /*  Ask the endpoint to stop. Actual terminatation may be delayed
        by the transport. */
    nn_ep_stop (ep);

    nn_ctx_leave (&self->ctx);

    return 0;
}